

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_NewSymbol(JSContext *ctx,JSString *p,int atom_type)

{
  JSRuntime *rt;
  JSAtom JVar1;
  JSValueUnion JVar2;
  int64_t iVar3;
  JSValue JVar4;
  
  rt = ctx->rt;
  JVar1 = __JS_NewAtom(rt,p,atom_type);
  if (JVar1 == 0) {
    JS_ThrowOutOfMemory(ctx);
    iVar3 = 6;
    JVar2.float64 = 0.0;
  }
  else {
    JVar2 = (JSValueUnion)((JSValueUnion *)(rt->atom_array + JVar1))->ptr;
    iVar3 = -8;
  }
  JVar4.tag = iVar3;
  JVar4.u.float64 = JVar2.float64;
  return JVar4;
}

Assistant:

static JSValue JS_NewSymbol(JSContext *ctx, JSString *p, int atom_type)
{
    JSRuntime *rt = ctx->rt;
    JSAtom atom;
    atom = __JS_NewAtom(rt, p, atom_type);
    if (atom == JS_ATOM_NULL)
        return JS_ThrowOutOfMemory(ctx);
    return JS_MKPTR(JS_TAG_SYMBOL, rt->atom_array[atom]);
}